

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O2

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  TryKind TVar4;
  pointer pSVar5;
  pointer ppEVar6;
  pointer piVar7;
  pointer puVar8;
  Expr *base;
  bool bVar9;
  int iVar10;
  Result RVar11;
  BlockExprBase<(wabt::ExprType)27> *pBVar12;
  IfExpr *pIVar13;
  BlockExprBase<(wabt::ExprType)8> *pBVar14;
  TryExpr *pTVar15;
  reference pEVar16;
  _func_int **pp_Var17;
  iterator *piVar18;
  Delegate *pDVar19;
  uint uVar20;
  pointer pCVar21;
  iterator rhs;
  iterator rhs_00;
  iterator rhs_01;
  iterator rhs_02;
  iterator rhs_03;
  iterator rhs_04;
  iterator local_40;
  
  pSVar5 = (this->state_stack_).
           super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar5) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  ppEVar6 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar6) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar6;
  }
  piVar7 = (this->expr_iter_stack_).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar7) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar7;
  }
  puVar8 = (this->catch_index_stack_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar8) {
    (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar8;
  }
  PushDefault(this,root_expr);
LAB_00133d05:
  do {
    pSVar5 = (this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_start == pSVar5) {
      return (Result)Ok;
    }
  } while (Catch < pSVar5[-1]);
  ppEVar6 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  base = ppEVar6[-1];
  switch(pSVar5[-1]) {
  case Default:
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5 + -1;
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar6 + -1;
    RVar11 = HandleDefaultState(this,base);
    goto joined_r0x00134067;
  case Block:
    pBVar14 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
    piVar18 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_02.node_ = (Expr *)0x0;
    rhs_02.list_ = &(pBVar14->block).exprs;
    bVar9 = intrusive_list<wabt::Expr>::iterator::operator!=(piVar18,rhs_02);
    if (!bVar9) {
      iVar10 = (*this->delegate_->_vptr_Delegate[4])(this->delegate_,pBVar14);
LAB_00133f4f:
      if (iVar10 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      goto LAB_00133d05;
    }
    break;
  case IfTrue:
    pIVar13 = cast<wabt::IfExpr,wabt::Expr>(base);
    piVar18 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_00.node_ = (Expr *)0x0;
    rhs_00.list_ = &(pIVar13->true_).exprs;
    bVar9 = intrusive_list<wabt::Expr>::iterator::operator!=(piVar18,rhs_00);
    if (!bVar9) {
      iVar10 = (*this->delegate_->_vptr_Delegate[0x13])(this->delegate_,pIVar13);
      if (iVar10 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      PushExprlist(this,IfFalse,base,&pIVar13->false_);
      goto LAB_00133d05;
    }
    break;
  case IfFalse:
    pIVar13 = cast<wabt::IfExpr,wabt::Expr>(base);
    piVar18 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_01.node_ = (Expr *)0x0;
    rhs_01.list_ = &pIVar13->false_;
    bVar9 = intrusive_list<wabt::Expr>::iterator::operator!=(piVar18,rhs_01);
    if (!bVar9) {
      iVar10 = (*this->delegate_->_vptr_Delegate[0x14])(this->delegate_,pIVar13);
      goto LAB_00133f4f;
    }
    break;
  case Loop:
    pBVar12 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(base);
    piVar18 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = &(pBVar12->block).exprs;
    bVar9 = intrusive_list<wabt::Expr>::iterator::operator!=(piVar18,rhs);
    if (!bVar9) {
      iVar10 = (*this->delegate_->_vptr_Delegate[0x1a])(this->delegate_,pBVar12);
      goto LAB_00133f4f;
    }
    break;
  case Try:
    pTVar15 = cast<wabt::TryExpr,wabt::Expr>(base);
    piVar18 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_03.node_ = (Expr *)0x0;
    rhs_03.list_ = &(pTVar15->block).exprs;
    bVar9 = intrusive_list<wabt::Expr>::iterator::operator!=(piVar18,rhs_03);
    if (bVar9) break;
    ppSVar1 = &(this->state_stack_).
               super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + -1;
    pppEVar2 = &(this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar2 = *pppEVar2 + -1;
    ppiVar3 = &(this->expr_iter_stack_).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppiVar3 = *ppiVar3 + -1;
    TVar4 = pTVar15->kind;
    if (TVar4 == Plain) {
      pDVar19 = this->delegate_;
      pp_Var17 = pDVar19->_vptr_Delegate;
    }
    else {
      if (TVar4 == Delegate) {
        RVar11.enum_ = (*this->delegate_->_vptr_Delegate[0x36])(this->delegate_,pTVar15);
        goto joined_r0x00134067;
      }
      if (TVar4 != Catch) goto LAB_00133d05;
      pCVar21 = (pTVar15->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pDVar19 = this->delegate_;
      pp_Var17 = pDVar19->_vptr_Delegate;
      if (pCVar21 !=
          (pTVar15->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar10 = (*pp_Var17[0x35])(pDVar19,pTVar15,pCVar21);
        if (iVar10 == 1) {
          return (Result)Error;
        }
        PushCatch(this,base,0,&pCVar21->exprs);
        goto LAB_00133d05;
      }
    }
    RVar11.enum_ = (*pp_Var17[0x37])(pDVar19,pTVar15);
    goto joined_r0x00134067;
  case Catch:
    pTVar15 = cast<wabt::TryExpr,wabt::Expr>(base);
    uVar20 = (this->catch_index_stack_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    piVar18 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_04.list_ = &(pTVar15->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar20].exprs;
    rhs_04.node_ = (Expr *)0x0;
    bVar9 = intrusive_list<wabt::Expr>::iterator::operator!=(piVar18,rhs_04);
    if (bVar9) {
      local_40 = intrusive_list<wabt::Expr>::iterator::operator++(piVar18,0);
      pEVar16 = intrusive_list<wabt::Expr>::iterator::operator*(&local_40);
      PushDefault(this,pEVar16);
    }
    else {
      PopCatch(this);
      uVar20 = uVar20 + 1;
      pCVar21 = (pTVar15->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar20 <
          (ulong)((long)(pTVar15->catches).
                        super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pCVar21 >> 7)) {
        pCVar21 = pCVar21 + uVar20;
        iVar10 = (*this->delegate_->_vptr_Delegate[0x35])(this->delegate_,pTVar15,pCVar21);
        if (iVar10 == 1) {
          return (Result)Error;
        }
        PushCatch(this,base,uVar20,&pCVar21->exprs);
      }
      else {
        RVar11.enum_ = (*this->delegate_->_vptr_Delegate[0x37])(this->delegate_,pTVar15);
joined_r0x00134067:
        if (RVar11.enum_ == Error) {
          return (Result)Error;
        }
      }
    }
    goto LAB_00133d05;
  }
  local_40 = intrusive_list<wabt::Expr>::iterator::operator++(piVar18,0);
  pEVar16 = intrusive_list<wabt::Expr>::iterator::operator*(&local_40);
  PushDefault(this,pEVar16);
  goto LAB_00133d05;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();
  catch_index_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopExprlist();
          switch (try_expr->kind) {
            case TryKind::Catch:
              if (!try_expr->catches.empty()) {
                Catch& catch_ = try_expr->catches[0];
                CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
                PushCatch(expr, 0, catch_.exprs);
              } else {
                CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              }
              break;
            case TryKind::Delegate:
              CHECK_RESULT(delegate_->OnDelegateExpr(try_expr));
              break;
            case TryKind::Plain:
              CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              break;
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        Index catch_index = catch_index_stack_.back();
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catches[catch_index].exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopCatch();
          catch_index++;
          if (catch_index < try_expr->catches.size()) {
            Catch& catch_ = try_expr->catches[catch_index];
            CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
            PushCatch(expr, catch_index, catch_.exprs);
          } else {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          }
        }
        break;
      }
    }
  }

  return Result::Ok;
}